

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O1

string * __thiscall
duckdb::Hugeint::ToString_abi_cxx11_(string *__return_storage_ptr__,Hugeint *this,hugeint_t input)

{
  long *plVar1;
  OutOfRangeException *this_00;
  size_type *psVar2;
  ulong uVar3;
  uint64_t *in_R8;
  hugeint_t hVar4;
  hugeint_t lhs;
  string result;
  uint64_t remainder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  ulong local_60;
  undefined1 local_58 [8];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar3 = input.lower;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  if (uVar3 == 0x8000000000000000 && this == (Hugeint *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"-170141183460469231731687303715884105728","");
  }
  else {
    local_60 = uVar3;
    if ((long)uVar3 < 0) {
      if (uVar3 == 0x8000000000000000 && this == (Hugeint *)0x0) {
        this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10,this,uVar3,input.upper);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"Negation of HUGEINT is out of range!","");
        OutOfRangeException::OutOfRangeException(this_00,&local_80);
        __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar3 = ~uVar3 + (ulong)(this == (Hugeint *)0x0);
      this = (Hugeint *)-(long)this;
    }
    hVar4.upper = uVar3;
    hVar4.lower = (uint64_t)this;
    if (this != (Hugeint *)0x0 || uVar3 != 0) {
      do {
        lhs.upper = 10;
        lhs.lower = hVar4.upper;
        hVar4 = DivModPositive((Hugeint *)hVar4.lower,lhs,(uint64_t)local_58,in_R8);
        local_50[0] = local_40;
        ::std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
        plVar1 = (long *)::std::__cxx11::string::_M_append
                                   ((char *)local_50,(ulong)local_a0._M_dataplus._M_p);
        psVar2 = (size_type *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar1 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_80.field_2._M_allocated_capacity = *psVar2;
          local_80.field_2._8_8_ = plVar1[3];
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        }
        else {
          local_80.field_2._M_allocated_capacity = *psVar2;
          local_80._M_dataplus._M_p = (pointer)*plVar1;
        }
        local_80._M_string_length = plVar1[1];
        *plVar1 = (long)psVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      } while (hVar4.lower != 0 || hVar4.upper != 0);
    }
    if (local_a0._M_string_length == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0","");
    }
    else if ((long)local_60 < 0) {
      ::std::operator+(__return_storage_ptr__,"-",&local_a0);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_a0._M_dataplus._M_p,
                 local_a0._M_dataplus._M_p + local_a0._M_string_length);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Hugeint::ToString(hugeint_t input) {
	uint64_t remainder;
	string result;
	if (input == NumericLimits<hugeint_t>::Minimum()) {
		return string(Hugeint::HUGEINT_MINIMUM_STRING);
	}
	bool negative = input.upper < 0;
	if (negative) {
		NegateInPlace(input);
	}
	while (true) {
		if (!input.lower && !input.upper) {
			break;
		}
		input = Hugeint::DivModPositive(input, 10, remainder);
		result = string(1, UnsafeNumericCast<char>('0' + remainder)) + result; // NOLINT
	}
	if (result.empty()) {
		// value is zero
		return "0";
	}
	return negative ? "-" + result : result;
}